

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O1

int xmlTextWriterWriteString(xmlTextWriterPtr writer,xmlChar *content)

{
  int iVar1;
  xmlLinkPtr lk;
  void *pvVar2;
  xmlChar *str;
  
  if (content == (xmlChar *)0x0 || writer == (xmlTextWriterPtr)0x0) {
    return -1;
  }
  lk = xmlListFront(writer->nodes);
  str = content;
  if ((lk == (xmlLinkPtr)0x0) || (pvVar2 = xmlLinkGetData(lk), pvVar2 == (void *)0x0))
  goto LAB_001d4a98;
  iVar1 = *(int *)((long)pvVar2 + 8);
  if (iVar1 != 3) {
    if (iVar1 == 2) {
      str = (xmlChar *)0x0;
      xmlBufAttrSerializeTxtContent(writer->out->buffer,writer->doc,(xmlAttrPtr)0x0,content);
      goto LAB_001d4a98;
    }
    if (iVar1 != 1) goto LAB_001d4a98;
  }
  str = xmlEncodeSpecialChars((xmlDoc *)0x0,content);
LAB_001d4a98:
  if (str == (xmlChar *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = xmlStrlen(str);
    iVar1 = xmlTextWriterWriteRawLen(writer,str,iVar1);
    if (str != content) {
      (*xmlFree)(str);
    }
  }
  return iVar1;
}

Assistant:

int
xmlTextWriterWriteString(xmlTextWriterPtr writer, const xmlChar * content)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;
    xmlChar *buf;

    if ((writer == NULL) || (content == NULL))
        return -1;

    sum = 0;
    buf = (xmlChar *) content;
    lk = xmlListFront(writer->nodes);
    if (lk != 0) {
        p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
        if (p != 0) {
            switch (p->state) {
                case XML_TEXTWRITER_NAME:
                case XML_TEXTWRITER_TEXT:
#if 0
                    buf = NULL;
		    xmlOutputBufferWriteEscape(writer->out, content, NULL);
#endif
                    buf = xmlEncodeSpecialChars(NULL, content);
                    break;
                case XML_TEXTWRITER_ATTRIBUTE:
                    buf = NULL;
                    xmlBufAttrSerializeTxtContent(writer->out->buffer,
                                                  writer->doc, NULL, content);
                    break;
		default:
		    break;
            }
        }
    }

    if (buf != NULL) {
        count = xmlTextWriterWriteRaw(writer, buf);

        if (buf != content)     /* buf was allocated by us, so free it */
            xmlFree(buf);

        if (count < 0)
            return -1;
        sum += count;
    }

    return sum;
}